

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O0

bool __thiscall llbuild::basic::FileInfo::isMissing(FileInfo *this)

{
  bool local_11;
  FileInfo *this_local;
  
  local_11 = false;
  if ((((this->device == 0) && (local_11 = false, this->inode == 0)) &&
      (local_11 = false, this->mode == 0)) &&
     ((local_11 = false, this->size == 0 && (local_11 = false, (this->modTime).seconds == 0)))) {
    local_11 = (this->modTime).nanoseconds == 0;
  }
  return local_11;
}

Assistant:

bool isMissing() const {
    // We use an all-zero FileInfo as a sentinel, under the assumption this can
    // never exist in normal circumstances.
    return (device == 0 && inode == 0 && mode == 0 && size == 0 &&
            modTime.seconds == 0 && modTime.nanoseconds == 0);
  }